

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O1

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::SkipComment(ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
              *this)

{
  Position *this_00;
  int *piVar1;
  char *pcVar2;
  bool bVar3;
  char *pcVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  bool bVar8;
  
  this_00 = &this->m_position;
  pcVar4 = (this->m_position).m_pos;
  pcVar2 = (this->m_position).m_end;
  if ((ulong)((long)pcVar2 - (long)pcVar4) < 2) {
LAB_003240bd:
    pcVar4 = (this->m_position).m_pos;
    pcVar2 = (this->m_position).m_end;
    if ((ulong)((long)pcVar2 - (long)pcVar4) < 2) {
LAB_003240d5:
      pcVar4 = (this->m_position).m_pos;
      if (((this->m_position).m_end == pcVar4) || (*pcVar4 != '#')) {
        bVar8 = false;
      }
      else {
        Position::operator+=(this_00,1);
        bVar8 = true;
        if ((this->m_position).m_pos != (this->m_position).m_end) {
          do {
            pcVar4 = (this->m_position).m_pos;
            pcVar2 = (this->m_position).m_end;
            if (1 < (ulong)((long)pcVar2 - (long)pcVar4)) {
              if (pcVar4 == pcVar2) {
                pcVar4 = "";
              }
              lVar6 = 0;
              while ("\r\n"[lVar6] == pcVar4[lVar6]) {
                lVar6 = lVar6 + 1;
                if (lVar6 == 2) {
                  lVar6 = 2;
                  Position::operator+=(this_00,2);
                  iVar7 = (this->m_position).line;
                  iVar5 = (this->m_position).col;
                  pcVar4 = (this->m_position).m_pos;
                  do {
                    iVar5 = iVar5 + -1;
                    if (pcVar4[lVar6 + -3] == '\n') {
                      iVar5 = (this->m_position).m_last_col;
                    }
                    iVar7 = iVar7 - (uint)(pcVar4[lVar6 + -3] == '\n');
                    lVar6 = lVar6 + -1;
                  } while (lVar6 != 0);
LAB_0032434f:
                  (this->m_position).line = iVar7;
                  (this->m_position).col = iVar5;
                  (this->m_position).m_pos = pcVar4 + -2;
                  return true;
                }
              }
            }
            pcVar4 = (this->m_position).m_pos;
            if ((pcVar4 != (this->m_position).m_end) && (*pcVar4 == '\n')) {
LAB_00324368:
              Position::operator++(this_00);
              pcVar4 = (this->m_position).m_pos;
              (this->m_position).m_pos = pcVar4 + -1;
              if (pcVar4[-1] == '\n') {
                (this->m_position).line = (this->m_position).line + -1;
                (this->m_position).col = (this->m_position).m_last_col;
                return true;
              }
              piVar1 = &(this->m_position).col;
              *piVar1 = *piVar1 + -1;
              return true;
            }
            Position::operator++(this_00);
          } while ((this->m_position).m_pos != (this->m_position).m_end);
        }
      }
    }
    else {
      if (pcVar4 == pcVar2) {
        pcVar4 = "";
      }
      lVar6 = 0;
      do {
        if ("//"[lVar6] != pcVar4[lVar6]) goto LAB_003240d5;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 2);
      Position::operator+=(this_00,2);
      bVar8 = true;
      if ((this->m_position).m_pos != (this->m_position).m_end) {
        do {
          pcVar4 = (this->m_position).m_pos;
          pcVar2 = (this->m_position).m_end;
          if (1 < (ulong)((long)pcVar2 - (long)pcVar4)) {
            if (pcVar4 == pcVar2) {
              pcVar4 = "";
            }
            lVar6 = 0;
            while ("\r\n"[lVar6] == pcVar4[lVar6]) {
              lVar6 = lVar6 + 1;
              if (lVar6 == 2) {
                lVar6 = 2;
                Position::operator+=(this_00,2);
                iVar7 = (this->m_position).line;
                iVar5 = (this->m_position).col;
                pcVar4 = (this->m_position).m_pos;
                do {
                  iVar5 = iVar5 + -1;
                  if (pcVar4[lVar6 + -3] == '\n') {
                    iVar5 = (this->m_position).m_last_col;
                  }
                  iVar7 = iVar7 - (uint)(pcVar4[lVar6 + -3] == '\n');
                  lVar6 = lVar6 + -1;
                } while (lVar6 != 0);
                goto LAB_0032434f;
              }
            }
          }
          pcVar4 = (this->m_position).m_pos;
          if ((pcVar4 != (this->m_position).m_end) && (*pcVar4 == '\n')) goto LAB_00324368;
          Position::operator++(this_00);
        } while ((this->m_position).m_pos != (this->m_position).m_end);
      }
    }
  }
  else {
    if (pcVar4 == pcVar2) {
      pcVar4 = "";
    }
    lVar6 = 0;
    do {
      if ("/*"[lVar6] != pcVar4[lVar6]) goto LAB_003240bd;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 2);
    Position::operator+=(this_00,2);
    bVar8 = true;
    if ((this->m_position).m_pos != (this->m_position).m_end) {
      do {
        pcVar4 = (this->m_position).m_pos;
        pcVar2 = (this->m_position).m_end;
        if (1 < (ulong)((long)pcVar2 - (long)pcVar4)) {
          if (pcVar4 == pcVar2) {
            pcVar4 = "";
          }
          lVar6 = 0;
          while ("*/"[lVar6] == pcVar4[lVar6]) {
            lVar6 = lVar6 + 1;
            if (lVar6 == 2) {
              Position::operator+=(this_00,2);
              return true;
            }
          }
        }
        bVar3 = Eol_(this,false);
        if (!bVar3) {
          Position::operator++(this_00);
        }
      } while ((this->m_position).m_pos != (this->m_position).m_end);
    }
  }
  return bVar8;
}

Assistant:

bool SkipComment() {
        if (Symbol_(m_multiline_comment_begin)) {
          while (m_position.has_more()) {
            if (Symbol_(m_multiline_comment_end)) {
              break;
            } else if (!Eol_()) {
              ++m_position;
            }
          }
          return true;
        } else if (Symbol_(m_singleline_comment)) {
          while (m_position.has_more()) {
            if (Symbol_(m_cr_lf)) {
              m_position -= 2;
              break;
            } else if (Char_('\n')) {
              --m_position;
              break;
            } else {
              ++m_position;
            }
          }
          return true;
        } else if (Symbol_(m_annotation)) {
          while (m_position.has_more()) {
            if (Symbol_(m_cr_lf)) {
              m_position -= 2;
              break;
            } else if (Char_('\n')) {
              --m_position;
              break;
            } else {
              ++m_position;
            }
          }
          return true;
        }
        return false;
      }